

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall
duckdb::PhysicalUpdateExtensions::GetGlobalSourceState
          (PhysicalUpdateExtensions *this,ClientContext *context)

{
  pointer pbVar1;
  pointer pUVar2;
  pointer pUVar3;
  ClientContext *in_RDX;
  pointer *__ptr;
  profiler_settings_t *this_00;
  pointer extension_name;
  templated_unique_single_t res;
  _Head_base<0UL,_duckdb::UpdateExtensionsGlobalState_*,_false> local_108;
  _Head_base<0UL,_duckdb::GlobalSourceState_*,_false> local_100;
  vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_> local_f8;
  undefined1 local_d8 [40];
  _Alloc_hider local_b0;
  pointer local_a0 [2];
  _Alloc_hider local_90;
  pointer local_80 [2];
  _Alloc_hider local_70;
  pointer local_60 [2];
  _Alloc_hider local_50;
  pointer local_40 [2];
  
  local_100._M_head_impl = (GlobalSourceState *)this;
  local_108._M_head_impl = (UpdateExtensionsGlobalState *)operator_new(0x70);
  ((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.can_block.
  _M_base._M_i = true;
  ((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.lock.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex + 0x10) = 0;
  ((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.lock.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex.__data.__list + 8) = (__pthread_internal_list *)0x0;
  ((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.
           blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_108._M_head_impl)->super_GlobalSourceState).super_StateWithBlockableTasks.
           blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl + 0x10) = (pointer)0x0;
  ((local_108._M_head_impl)->super_GlobalSourceState)._vptr_GlobalSourceState =
       (_func_int **)&PTR__UpdateExtensionsGlobalState_024a41d0;
  ((local_108._M_head_impl)->update_result_entries).
  super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_108._M_head_impl)->update_result_entries).
  super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_108._M_head_impl)->update_result_entries).
  super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_108._M_head_impl)->offset = 0;
  this_00 = &(context->config).profiler_settings;
  pUVar2 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
           ::operator->((unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                         *)this_00);
  if ((pUVar2->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pUVar2->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ExtensionHelper::UpdateExtensions
              ((vector<duckdb::ExtensionUpdateResult,_true> *)&local_f8,in_RDX);
    pUVar3 = unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
                           *)&local_108);
    local_d8._0_8_ =
         (pUVar3->update_result_entries).
         super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         .
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_d8._8_8_ =
         (pUVar3->update_result_entries).
         super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         .
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._16_8_ =
         (pUVar3->update_result_entries).
         super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         .
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pUVar3->update_result_entries).
    super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pUVar3->update_result_entries).
    super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pUVar3->update_result_entries).
    super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f8.
         super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
    ~vector((vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_> *
            )local_d8);
    ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
    ~vector(&local_f8);
  }
  else {
    pUVar2 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
             ::operator->((unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                           *)this_00);
    extension_name =
         (pUVar2->extensions_to_update).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pUVar2->extensions_to_update).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (extension_name != pbVar1) {
      do {
        pUVar3 = unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
                 ::operator->((unique_ptr<duckdb::UpdateExtensionsGlobalState,_std::default_delete<duckdb::UpdateExtensionsGlobalState>,_true>
                               *)&local_108);
        ExtensionHelper::UpdateExtension((ExtensionUpdateResult *)local_d8,in_RDX,extension_name);
        ::std::vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
        ::emplace_back<duckdb::ExtensionUpdateResult>
                  (&(pUVar3->update_result_entries).
                    super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
                   ,(ExtensionUpdateResult *)local_d8);
        if ((pointer *)local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        if ((pointer *)local_70._M_p != local_60) {
          operator_delete(local_70._M_p);
        }
        if ((pointer *)local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if ((pointer *)local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p);
        }
        if ((undefined1 *)local_d8._8_8_ != local_d8 + 0x18) {
          operator_delete((void *)local_d8._8_8_);
        }
        extension_name = extension_name + 1;
      } while (extension_name != pbVar1);
    }
  }
  *(UpdateExtensionsGlobalState **)local_100._M_head_impl = local_108._M_head_impl;
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
          )local_100._M_head_impl;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalUpdateExtensions::GetGlobalSourceState(ClientContext &context) const {
	auto res = make_uniq<UpdateExtensionsGlobalState>();

	if (info->extensions_to_update.empty()) {
		// Update all
		res->update_result_entries = ExtensionHelper::UpdateExtensions(context);
	} else {
		// Update extensions in extensions_to_update
		for (const auto &ext : info->extensions_to_update) {
			res->update_result_entries.emplace_back(ExtensionHelper::UpdateExtension(context, ext));
		}
	}

	return std::move(res);
}